

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O3

void post_increment_suite::test_u16string(void)

{
  bool bVar1;
  pointer ptVar2;
  iterator result;
  iterator where;
  variable data;
  undefined1 local_80 [24];
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  basic_variable<std::allocator<char>_> local_38;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_38,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_50,&local_38,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_68,&local_38,false);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::
          iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
          ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)local_50,(iterator *)local_68);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x3da,"void post_increment_suite::test_u16string()",!bVar1);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_68 + 8));
  ptVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_50);
  boost::detail::test_impl
            ("where->same<variable::u16string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x3db,"void post_increment_suite::test_u16string()",
             (ptVar2->storage).current == '\x11');
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator++((iterator *)local_68,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_50,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_80,&local_38,false);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::
          iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
          ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)local_68,(iterator *)local_80);
  boost::detail::test_impl
            ("result != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x3dd,"void post_increment_suite::test_u16string()",!bVar1);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_80 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_80,&local_38,false);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::
          iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
          ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)local_50,(iterator *)local_80);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x3de,"void post_increment_suite::test_u16string()",bVar1);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_80 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_68 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_50 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_38);
  return;
}

Assistant:

void test_u16string()
{
    variable data(u"charlie");
    variable::iterator where = data.begin();
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<variable::u16string_type>());
    variable::iterator result = where++;
    TRIAL_PROTOCOL_TEST(result != data.end());
    TRIAL_PROTOCOL_TEST(where == data.end());
}